

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::on_string
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info,string_t *str)

{
  bool bVar1;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  allocator<char> local_21d;
  allocator<char> local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  QString value;
  string_t local_1f8;
  string_t local_1e0;
  string_t local_1c8;
  string_t local_1b0;
  string_t local_198;
  string_t local_180;
  qstring_wrapper_t local_168;
  qstring_wrapper_t local_150;
  qstring_wrapper_t local_138;
  qstring_wrapper_t local_120;
  qstring_wrapper_t local_108;
  qstring_wrapper_t local_f0;
  qstring_wrapper_t local_d8;
  qstring_wrapper_t local_c0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_any_child_defined
                    (&this->super_tag_t<cfgfile::qstring_trait_t>);
  if (!bVar1) {
    value.d.d = (str->m_str).d.d;
    value.d.ptr = (str->m_str).d.ptr;
    value.d.size = (str->m_str).d.size;
    if (value.d.d != (Data *)0x0) {
      LOCK();
      ((value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&this->m_value);
    (this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined = true;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&value.d);
    return;
  }
  this_00 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,"Value \"",&local_219);
  qstring_trait_t::from_ascii(&local_180,(string *)&value);
  operator+(&local_168,&local_180,str);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\" for tag \"",&local_21a)
  ;
  qstring_trait_t::from_ascii(&local_198,&local_48);
  operator+(&local_150,&local_168,&local_198);
  operator+(&local_138,&local_150,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"\" must be defined before any child tag. In file \"",&local_21b);
  qstring_trait_t::from_ascii(&local_1b0,&local_68);
  operator+(&local_120,&local_138,&local_1b0);
  operator+(&local_108,&local_120,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"\" on line ",&local_21c);
  qstring_trait_t::from_ascii(&local_1c8,&local_88);
  operator+(&local_f0,&local_108,&local_1c8);
  qstring_trait_t::to_string(&local_1e0,info->m_line_number);
  operator+(&local_d8,&local_f0,&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,".",&local_21d);
  qstring_trait_t::from_ascii(&local_1f8,&local_a8);
  operator+(&local_c0,&local_d8,&local_1f8);
  exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,&local_c0);
  __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( this->is_any_child_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Value \"" ) + str +
				Trait::from_ascii( "\" for tag \"" ) + this->name() +
				Trait::from_ascii( "\" must be defined before any "
					"child tag. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		const QString value = format_t< QString, Trait >::from_string( info, str );

		m_value.append( value );

		this->set_defined();
	}